

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_pixelformat.cpp
# Opt level: O2

char * get_format_name(ALLEGRO_BITMAP *bmp)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  if (bmp == (ALLEGRO_BITMAP *)0x0) {
    return "none";
  }
  iVar2 = al_get_bitmap_format();
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (lVar3 + 0x10 == 0x200) {
      return "unknown";
    }
    lVar1 = lVar3 + 0x10;
  } while (*(int *)((long)&formats[0].format + lVar3) != iVar2);
  return *(char **)((long)&formats[0].name + lVar3);
}

Assistant:

const char *get_format_name(ALLEGRO_BITMAP *bmp)
{
   if (!bmp)
      return "none";

   int format = al_get_bitmap_format(bmp);
   for (unsigned i = 0; i < NUM_FORMATS; i++) {
      if (formats[i].format == format)
         return formats[i].name;
   }
   return "unknown";
}